

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_limit.cpp
# Opt level: O1

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalLimit *limit,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  Optimizer *in_RAX;
  Binder *pBVar1;
  Optimizer *pOVar2;
  pointer *__ptr;
  Optimizer *local_28;
  
  local_28 = in_RAX;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)(node_ptr + 2),0);
  PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffd8,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)limit);
  if (local_28 != (Optimizer *)0x0) {
    operator_delete(local_28);
  }
  local_28 = (Optimizer *)0x0;
  if (*(char *)&node_ptr[0xd].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == '\x01') {
    pBVar1 = (Binder *)BoundLimitNode::GetConstantValue((BoundLimitNode *)(node_ptr + 0xd));
    pOVar2 = (Optimizer *)operator_new(0x20);
    *(undefined1 *)&pOVar2->context = 1;
    pOVar2->binder = pBVar1;
    *(undefined1 *)&(pOVar2->rewriter).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor = 1
    ;
    (pOVar2->rewriter).rules.
    super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar1;
  }
  else {
    this->optimizer = (Optimizer *)0x0;
    pOVar2 = (Optimizer *)0x0;
  }
  this->optimizer = pOVar2;
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalLimit &limit,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// propagate statistics in the child node
	PropagateStatistics(limit.children[0]);
	// return the node stats, with as expected cardinality the amount specified in the limit
	if (limit.limit_val.Type() == LimitNodeType::CONSTANT_VALUE) {
		auto constant_limit = limit.limit_val.GetConstantValue();
		return make_uniq<NodeStatistics>(constant_limit, constant_limit);
	}
	return nullptr;
}